

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofDefaultTest_Test::TestBody
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofDefaultTest_Test *this)

{
  allocator<const_google::protobuf::FieldDescriptor_*> *this_00;
  Reflection *pRVar1;
  Descriptor *pDVar2;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l_00;
  bool bVar3;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  TestAllTypes *this_01;
  char *in_R9;
  string local_2c8;
  AssertHelper local_2a8;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__5;
  Message local_278;
  int local_270;
  uint32_t local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_238;
  Message local_230;
  string_view local_228;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__3;
  FieldDescriptor *local_1b0;
  iterator local_1a8;
  size_type local_1a0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_198;
  AssertHelper local_180;
  Message local_178;
  int local_170;
  uint32_t local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f0;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a8;
  Message local_a0;
  string_view local_98;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  allocator<const_google::protobuf::FieldDescriptor_*> local_59;
  FieldDescriptor *local_58;
  iterator local_50;
  size_type local_48;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_40;
  string_view local_28;
  FieldDescriptor *local_18;
  FieldDescriptor *f;
  NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofDefaultTest_Test *this_local;
  
  this_01 = &(this->super_NoFieldPresenceSwapFieldTest).m1_;
  f = (FieldDescriptor *)this;
  proto2_nofieldpresence_unittest::TestAllTypes::set_oneof_uint32(this_01,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"oneof_uint32")
  ;
  local_58 = NoFieldPresenceSwapFieldTest::FindFieldByName
                       (&this->super_NoFieldPresenceSwapFieldTest,local_28);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r1_;
  local_50 = &local_58;
  local_48 = 1;
  local_18 = local_58;
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(&local_59);
  __l_00._M_len = local_48;
  __l_00._M_array = local_50;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_40,__l_00,&local_59);
  Reflection::SwapFields
            (pRVar1,&this_01->super_Message,
             &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,&local_40);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_40);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator(&local_59);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r1_;
  pDVar2 = (this->super_NoFieldPresenceSwapFieldTest).d1_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"oneof_string")
  ;
  pFVar4 = Descriptor::FindFieldByName(pDVar2,local_98);
  bVar3 = Reflection::HasField
                    (pRVar1,&(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,pFVar4);
  local_81 = (bool)((bVar3 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar3) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_80,
               (AssertionResult *)"r1_->HasField(m1_, d1_->FindFieldByName(\"oneof_string\"))",
               "true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x26a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_d9 = Reflection::HasField
                       ((this->super_NoFieldPresenceSwapFieldTest).r2_,
                        &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,local_18);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar3) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_d8,
               (AssertionResult *)"r2_->HasField(m2_, f)","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x26b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  bVar3 = proto2_nofieldpresence_unittest::TestAllTypes::has_oneof_string
                    (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  local_121 = (bool)((bVar3 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar3) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_120,
               (AssertionResult *)"m1_.has_oneof_string()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x26c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_16c = proto2_nofieldpresence_unittest::TestAllTypes::oneof_uint32
                        (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  local_170 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_168,"m2_.oneof_uint32()","1",&local_16c,&local_170);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar3) {
    testing::Message::Message(&local_178);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x26d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r2_;
  local_1b0 = local_18;
  local_1a8 = &local_1b0;
  local_1a0 = 1;
  this_00 = (allocator<const_google::protobuf::FieldDescriptor_*> *)
            ((long)&gtest_ar__3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(this_00);
  __l._M_len = local_1a0;
  __l._M_array = local_1a8;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_198,__l,this_00);
  Reflection::SwapFields
            (pRVar1,&(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,
             &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,&local_198);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_198);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator
            ((allocator<const_google::protobuf::FieldDescriptor_*> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1c9 = Reflection::HasField
                        ((this->super_NoFieldPresenceSwapFieldTest).r1_,
                         &(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,local_18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar3) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1c8,
               (AssertionResult *)"r1_->HasField(m1_, f)","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x274,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r2_;
  pDVar2 = (this->super_NoFieldPresenceSwapFieldTest).d2_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_228,"oneof_string");
  pFVar4 = Descriptor::FindFieldByName(pDVar2,local_228);
  bVar3 = Reflection::HasField
                    (pRVar1,&(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,pFVar4);
  local_211 = (bool)((bVar3 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_210,&local_211,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar3) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_210,
               (AssertionResult *)"r2_->HasField(m2_, d2_->FindFieldByName(\"oneof_string\"))",
               "true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x275,pcVar5);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_26c = proto2_nofieldpresence_unittest::TestAllTypes::oneof_uint32
                        (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  local_270 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_268,"m1_.oneof_uint32()","1",&local_26c,&local_270);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar3) {
    testing::Message::Message(&local_278);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x276,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  bVar3 = proto2_nofieldpresence_unittest::TestAllTypes::has_oneof_string
                    (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  local_291 = (bool)((bVar3 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar3) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_290,(AssertionResult *)"m2_.has_oneof_string()","true",
               "false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x277,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest, ReflectionSwapFieldOneofDefaultTest) {
  m1_.set_oneof_uint32(1);

  const FieldDescriptor* f = FindFieldByName("oneof_uint32");
  r1_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_FALSE(r1_->HasField(m1_, d1_->FindFieldByName("oneof_string")));
  EXPECT_TRUE(r2_->HasField(m2_, f));
  EXPECT_FALSE(m1_.has_oneof_string());
  EXPECT_EQ(m2_.oneof_uint32(), 1);

  // It doesn't matter which reflection or descriptor gets used; swapping should
  // still work if m2_'s descriptor is provided.
  r2_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_TRUE(r1_->HasField(m1_, f));
  EXPECT_FALSE(r2_->HasField(m2_, d2_->FindFieldByName("oneof_string")));
  EXPECT_EQ(m1_.oneof_uint32(), 1);
  EXPECT_FALSE(m2_.has_oneof_string());
}